

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void console::replace_last(char ch)

{
  char in_DIL;
  
  fprintf(out,"\b%c",(ulong)(uint)(int)in_DIL);
  return;
}

Assistant:

static void replace_last(char ch) {
#if defined(_WIN32)
        pop_cursor();
        put_codepoint(&ch, 1, 1);
#else
        fprintf(out, "\b%c", ch);
#endif
    }